

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBody::ComputeQ
          (ChLoadXYZROTnodeBody *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVectorDynamic<> *vector;
  ChMatrix33<double> *this_00;
  ChQuaternion<double> *this_01;
  undefined1 auVar1 [16];
  _func_int **pp_Var2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector<double> local_4f8;
  ChVector<double> v;
  shared_ptr<chrono::ChBody> mbodyB;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> mbodyA;
  double local_498;
  double dStack_490;
  double local_488;
  ChVector<double> v_1;
  ChVector<double> abs_torque;
  ChVector<double> abs_force;
  ChFrameMoving<double> local_418;
  ChFrameMoving<double> rel_AB;
  ChFrameMoving<double> local_218;
  undefined1 local_120 [24];
  double local_108;
  ChQuaternion<double> local_100 [3];
  ChCoordsys<double> local_98 [2];
  
  v_1.m_data[1] = v_1.m_data[0];
  std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzrot,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mbodyA);
  std::dynamic_pointer_cast<chrono::ChBody,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mbodyB);
  local_218.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  rel_AB.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            ((ChFrameMoving<double> *)local_120,(ChVector<double> *)&rel_AB,
             (ChQuaternion<double> *)&local_218);
  rel_AB.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_418.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_418.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_418.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  rel_AB.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_218,(ChVector<double> *)&local_418,(ChQuaternion<double> *)&rel_AB);
  if (state_x == (ChState *)0x0) {
    ChFrame<double>::SetCoord
              ((ChFrame<double> *)local_120,
               (ChCoordsys<double> *)
               &((mbodyA.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_ChNodeFEAbase).field_0x20);
    ChFrame<double>::SetCoord
              (&local_218.super_ChFrame<double>,
               &((mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord);
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,
               &state_x->super_ChVectorDynamic<double>,0,7);
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&rel_AB,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_418,(type *)0x0);
    ChFrame<double>::SetCoord((ChFrame<double> *)local_120,(ChCoordsys<double> *)&rel_AB);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,
               &state_x->super_ChVectorDynamic<double>,7,7);
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&rel_AB,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_418,(type *)0x0);
    ChFrame<double>::SetCoord(&local_218.super_ChFrame<double>,(ChCoordsys<double> *)&rel_AB);
  }
  if (state_w == (ChStateDelta *)0x0) {
    ChCoordsys<double>::operator=
              (local_98,(ChCoordsys<double> *)
                        &(mbodyA.
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->field_0xa0);
    ChCoordsys<double>::operator=
              (&local_218.coord_dt,
               &((mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt);
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,0,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_418,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    local_98[0].pos.m_data[0] = (double)local_418.super_ChFrame<double>._vptr_ChFrame;
    local_98[0].pos.m_data[1] = local_418.super_ChFrame<double>.coord.pos.m_data[0];
    local_98[0].pos.m_data[2] = local_418.super_ChFrame<double>.coord.pos.m_data[1];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,3,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_418,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc
              ((ChFrameMoving<double> *)local_120,(ChVector<double> *)&local_418);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,6,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_418,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    local_218.coord_dt.pos.m_data[0] = (double)local_418.super_ChFrame<double>._vptr_ChFrame;
    local_218.coord_dt.pos.m_data[1] = local_418.super_ChFrame<double>.coord.pos.m_data[0];
    local_218.coord_dt.pos.m_data[2] = local_418.super_ChFrame<double>.coord.pos.m_data[1];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&rel_AB,
               &state_w->super_ChVectorDynamic<double>,9,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_418,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &rel_AB,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_218,(ChVector<double> *)&local_418);
  }
  ChFrameMoving<double>::ChFrameMoving(&local_418,&this->loc_application_A);
  ChFrameMoving<double>::operator>>(&rel_AB,&local_418,(ChFrameMoving<double> *)local_120);
  ChFrameMoving<double>::operator=(&this->frame_Aw,&rel_AB);
  ChFrameMoving<double>::ChFrameMoving(&local_418,&this->loc_application_B);
  ChFrameMoving<double>::operator>>(&rel_AB,&local_418,&local_218);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&rel_AB);
  ChFrameMoving<double>::GetInverse(&local_418,&this->frame_Bw);
  ChFrameMoving<double>::operator>>(&rel_AB,&this->frame_Aw,&local_418);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&rel_AB,&this->locB_force,&this->locB_torque);
  this_00 = &(this->frame_Bw).super_ChFrame<double>.Amatrix;
  ChMatrix33<double>::operator*(this_00,&this->locB_force);
  ChMatrix33<double>::operator*(this_00,&this->locB_torque);
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])(this->frame_Aw).super_ChFrame<double>.coord.pos.m_data,
                  local_120._8_16_);
  v.m_data[2] = (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[2] - local_108;
  auVar5._0_8_ = -abs_force.m_data[2];
  auVar5._8_8_ = 0x8000000000000000;
  local_4f8.m_data[0] = -abs_force.m_data[0];
  local_4f8.m_data[1] = -abs_force.m_data[1];
  local_4f8.m_data[2] = (double)vmovlpd_avx(auVar5);
  ChVector<double>::operator%((ChVector<double> *)&local_418,&v,&local_4f8);
  ChQuaternion<double>::RotateBack(local_100,(ChVector<double> *)&local_418);
  auVar6._0_8_ = -abs_torque.m_data[2];
  auVar6._8_8_ = 0x8000000000000000;
  local_418.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)((ulong)abs_torque.m_data[0] ^ 0x8000000000000000);
  local_418.super_ChFrame<double>.coord.pos.m_data[0] = -abs_torque.m_data[1];
  local_418.super_ChFrame<double>.coord.pos.m_data[1] = (double)vmovlpd_avx(auVar6);
  ChQuaternion<double>::RotateBack(local_100,(ChVector<double> *)&local_418);
  vector = &(this->super_ChLoadCustomMultiple).load_Q;
  local_4f8.m_data[0] = (double)&abs_force;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,vector,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_418,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_4f8);
  v_1.m_data[0] = (double)&local_4f8;
  local_4f8.m_data[0] = local_498 + v.m_data[0];
  local_4f8.m_data[1] = dStack_490 + v.m_data[1];
  local_4f8.m_data[2] = local_488 + v.m_data[2];
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,vector,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_418,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&v_1);
  auVar1._8_8_ = local_218.super_ChFrame<double>.coord.pos.m_data[1];
  auVar1._0_8_ = local_218.super_ChFrame<double>.coord.pos.m_data[0];
  v_1.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])(this->frame_Bw).super_ChFrame<double>.coord.pos.m_data,
                  auVar1);
  v_1.m_data[2] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
       local_218.super_ChFrame<double>.coord.pos.m_data[2];
  ChVector<double>::operator%(&local_4f8,&v_1,&abs_force);
  this_01 = &local_218.super_ChFrame<double>.coord.rot;
  ChQuaternion<double>::RotateBack(this_01,&local_4f8);
  dVar4 = local_418.super_ChFrame<double>.coord.pos.m_data[1];
  dVar3 = local_418.super_ChFrame<double>.coord.pos.m_data[0];
  pp_Var2 = local_418.super_ChFrame<double>._vptr_ChFrame;
  ChQuaternion<double>::RotateBack(this_01,&abs_torque);
  v.m_data[0] = (double)local_418.super_ChFrame<double>._vptr_ChFrame;
  v.m_data[1] = local_418.super_ChFrame<double>.coord.pos.m_data[0];
  v.m_data[2] = local_418.super_ChFrame<double>.coord.pos.m_data[1];
  local_4f8.m_data[0] = (double)&abs_force;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,vector,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_418,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_4f8);
  v_1.m_data[0] = (double)&local_4f8;
  local_4f8.m_data[0] = (double)pp_Var2 + v.m_data[0];
  local_4f8.m_data[1] = dVar3 + v.m_data[1];
  local_4f8.m_data[2] = dVar4 + v.m_data[2];
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_418,vector,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_418,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&v_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mbodyB.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mbodyA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChLoadXYZROTnodeBody::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbodyA = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetCoord(state_x->segment(0, 7));
        bodycoordB.SetCoord(state_x->segment(7, 7));
    } else {
        bodycoordA.SetCoord(mbodyA->coord);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordA.SetWvel_loc(state_w->segment(3, 3));
        bodycoordB.SetPos_dt(state_w->segment(6, 3));
        bodycoordB.SetWvel_loc(state_w->segment(9, 3));
    } else {
        bodycoordA.SetCoord_dt(mbodyA->GetCoord_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = ChFrameMoving<>(loc_application_A) >> bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForceTorque(rel_AB, locB_force, locB_torque);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(locB_force);
    ChVector<> abs_torque = frame_Bw.TransformDirectionLocalToParent(locB_torque);

    // Compute Q

    ChVector<> loc_ftorque = bodycoordA.GetRot().RotateBack(((frame_Aw.GetPos() - bodycoordA.GetPos()) % -abs_force));
    ChVector<> loc_torque = bodycoordA.GetRot().RotateBack(-abs_torque);
    load_Q.segment(0, 3) = -abs_force.eigen();
    load_Q.segment(3, 3) = (loc_ftorque + loc_torque).eigen();

    loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    loc_torque = bodycoordB.GetRot().RotateBack(abs_torque);
    load_Q.segment(6, 3) = abs_force.eigen();
    load_Q.segment(9, 3) = (loc_ftorque + loc_torque).eigen();
}